

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O1

vector<long,_std::allocator<long>_> *
phmap::priv::GenerateValuesWithSeed<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,size_t n,int maxval,int seed)

{
  iterator __position;
  long lVar1;
  size_t sVar2;
  vector<int,_std::allocator<int>_> nums;
  long local_48;
  vector<int,_std::allocator<int>_> local_40;
  
  GenerateNumbersWithSeed(&local_40,n,maxval,seed);
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::reserve(__return_storage_ptr__,n);
  if (n != 0) {
    sVar2 = 0;
    do {
      lVar1 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar2];
      if (maxval < local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar2]) {
        __assert_fail("i <= maxval",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.h"
                      ,0x166,"K phmap::priv::Generator<long>::operator()(int) const [K = long]");
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_48 = lVar1;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,__position,&local_48);
      }
      else {
        *__position._M_current = lVar1;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }